

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

weak_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::find_disconnect_candidate_torrent(session_impl *this)

{
  torrent *ptVar1;
  long lVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  bool bVar8;
  uint uVar9;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  weak_ptr<libtorrent::aux::torrent> wVar13;
  
  plVar7 = *(long **)(in_RSI + 0x1428);
  plVar12 = *(long **)(in_RSI + 0x1430);
  plVar11 = plVar7 + 2;
  plVar10 = plVar7;
  if (plVar11 != plVar12 && plVar7 != plVar12) {
    do {
      ptVar1 = (torrent *)*plVar11;
      iVar5 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(ptVar1->super_torrent_hot_members).m_connections.
                                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                           .
                                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                           ._M_impl + 8) -
                           (long)(ptVar1->super_torrent_hot_members).m_connections.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar6 = (int)((ulong)((long)(ptVar1->m_peers_to_disconnect).
                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(ptVar1->m_peers_to_disconnect).
                                 super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar2 = *plVar10;
      bVar8 = ((int)((ulong)(*(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38)) >> 3) !=
              (int)((ulong)(*(long *)(lVar2 + 0x500) - *(long *)(lVar2 + 0x4f8)) >> 4)) !=
              (iVar5 == iVar6);
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71((int7)((ulong)lVar2 >> 8),bVar8);
      if (bVar8) {
        bVar8 = torrent::is_finished(ptVar1);
        bVar4 = torrent::is_finished((torrent *)*plVar10);
        ptVar1 = (torrent *)*plVar11;
        if (bVar8 == bVar4) {
          lVar2 = *plVar10;
          uVar9 = (int)((ulong)(*(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38)) >> 3) -
                  (int)((ulong)(*(long *)(lVar2 + 0x500) - *(long *)(lVar2 + 0x4f8)) >> 4);
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar9;
          bVar8 = (int)uVar9 <
                  (int)((ulong)((long)*(pointer *)
                                       ((long)&(ptVar1->super_torrent_hot_members).m_connections.
                                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                               .
                                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                               ._M_impl + 8) -
                               (long)(ptVar1->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (int)((ulong)((long)(ptVar1->m_peers_to_disconnect).
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(ptVar1->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        else {
          bVar8 = torrent::is_finished(ptVar1);
          in_RDX._M_pi = extraout_RDX;
        }
      }
      else {
        bVar8 = iVar5 != iVar6;
      }
      plVar7 = plVar11;
      if (bVar8 == false) {
        plVar7 = plVar10;
      }
      plVar11 = plVar11 + 2;
      plVar10 = plVar7;
    } while (plVar11 != plVar12);
    plVar12 = *(long **)(in_RSI + 0x1430);
  }
  if (plVar7 == plVar12) {
    (this->super_session_interface).super_session_logger._vptr_session_logger = (_func_int **)0x0;
    (this->super_dht_observer).super_dht_logger._vptr_dht_logger = (_func_int **)0x0;
  }
  else {
    (this->super_session_interface).super_session_logger._vptr_session_logger =
         (_func_int **)*plVar7;
    pp_Var3 = (_func_int **)plVar7[1];
    (this->super_dht_observer).super_dht_logger._vptr_dht_logger = pp_Var3;
    if (pp_Var3 != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)pp_Var3 + 0xc) = *(int *)((long)pp_Var3 + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)pp_Var3 + 0xc) = *(int *)((long)pp_Var3 + 0xc) + 1;
      }
    }
  }
  wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<libtorrent::aux::torrent>)
         wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<torrent> session_impl::find_disconnect_candidate_torrent() const
	{
		auto const i = std::min_element(m_torrents.begin(), m_torrents.end()
			, &compare_disconnect_torrent);

		TORRENT_ASSERT(i != m_torrents.end());
		if (i == m_torrents.end()) return std::shared_ptr<torrent>();

		return *i;
	}